

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_79f::RingIndexTest_RingIndexF_Test::TestBody(RingIndexTest_RingIndexF_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  char *pcVar3;
  RawType RVar4;
  AssertHelper local_168;
  Message local_160;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_5;
  Message local_138;
  unsigned_long local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  Message local_110;
  unsigned_long local_108;
  RingIndex local_100;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  unsigned_long local_d0;
  RingIndex local_c8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  unsigned_long local_98;
  RingIndex local_90;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  RawType max;
  AssertHelper local_60 [3];
  Message local_48;
  RingIndex local_40;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  RingIndex ri;
  RingIndexTest_RingIndexF_Test *this_local;
  
  Sledge::RingIndex::RingIndex((RingIndex *)&gtest_ar.message_,0,0x100);
  Sledge::RingIndex::get_max((RingIndex *)&gtest_ar.message_);
  Sledge::RingIndex::operator+(&local_40,(RawType)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,Sledge::RingIndex>
            ((EqHelper<false> *)local_30,"ri + ri.get_max()","ri",&local_40,
             (RingIndex *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(&local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(local_60,&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar2) {
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7fffffffffffffff;
    Sledge::RingIndex::set_max((RingIndex *)&gtest_ar.message_,0x7fffffffffffffff);
    Sledge::RingIndex::set((RingIndex *)&gtest_ar.message_,(ulong)gtest_ar_1.message_.ptr_ / 200);
    Sledge::RingIndex::operator+(&local_90,(RawType)&gtest_ar.message_);
    RVar4 = Sledge::RingIndex::get((RingIndex *)&gtest_ar.message_);
    local_98 = RVar4 + 0x16;
    testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,unsigned_long>
              ((EqHelper<false> *)local_80,"ri + (max + 22)","ri.get() + 22",&local_90,&local_98);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar2) {
      testing::Message::Message(&local_a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                 ,0x61,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (bVar2) {
      Sledge::RingIndex::operator+(&local_c8,(RawType)&gtest_ar.message_);
      RVar4 = Sledge::RingIndex::get((RingIndex *)&gtest_ar.message_);
      local_d0 = RVar4 + 0x643e;
      testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,unsigned_long>
                ((EqHelper<false> *)local_b8,"ri + (max + 25662)","ri.get() + 25662",&local_c8,
                 &local_d0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar2) {
        testing::Message::Message(&local_d8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                   ,0x62,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if (bVar2) {
        Sledge::RingIndex::operator+(&local_100,(RawType)&gtest_ar.message_);
        RVar4 = Sledge::RingIndex::get((RingIndex *)&gtest_ar.message_);
        local_108 = RVar4 + 0x1c5;
        testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,unsigned_long>
                  ((EqHelper<false> *)local_f0,"ri + 453","ri.get() + 453",&local_100,&local_108);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
        if (!bVar2) {
          testing::Message::Message(&local_110);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                     ,99,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_110);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
        if (bVar2) {
          Sledge::RingIndex::set_max((RingIndex *)&gtest_ar.message_,0xffffffffffffff2c);
          Sledge::RingIndex::operator=((RingIndex *)&gtest_ar.message_,0);
          Sledge::RingIndex::operator+=((RingIndex *)&gtest_ar.message_,0xffffffffffffffff);
          RVar4 = Sledge::RingIndex::get_max((RingIndex *)&gtest_ar.message_);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = RVar4;
          local_130 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) % auVar1,0);
          testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,unsigned_long>
                    ((EqHelper<false> *)local_128,"ri","RingIndex::LIMIT_MAX % ri.get_max()",
                     (RingIndex *)&gtest_ar.message_,&local_130);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
          if (!bVar2) {
            testing::Message::Message(&local_138);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                       ,0x68,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_138);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_138);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
          if (bVar2) {
            RVar4 = Sledge::RingIndex::get_max((RingIndex *)&gtest_ar.message_);
            Sledge::RingIndex::set((RingIndex *)&gtest_ar.message_,RVar4);
            local_154 = 0;
            testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,int>
                      ((EqHelper<false> *)local_150,"ri","0",(RingIndex *)&gtest_ar.message_,
                       &local_154);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
            if (!bVar2) {
              testing::Message::Message(&local_160);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
              testing::internal::AssertHelper::AssertHelper
                        (&local_168,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                         ,0x6b,pcVar3);
              testing::internal::AssertHelper::operator=(&local_168,&local_160);
              testing::internal::AssertHelper::~AssertHelper(&local_168);
              testing::Message::~Message(&local_160);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST( RingIndexTest, RingIndexF)
	{
		RingIndex ri(0,256);
		ASSERT_EQ( ri + ri.get_max(), ri);
		
		auto max = RingIndex::LIMIT_MAX / 2;
		ri.set_max(max);
		ri.set( max / 200 );  // value much less than max 
		ASSERT_EQ( ri + (max + 22), ri.get() + 22 );
		ASSERT_EQ( ri + (max + 25662), ri.get() + 25662 );
		ASSERT_EQ( ri + 453, ri.get() + 453 );  // no overflow
		
		ri.set_max( RingIndex::LIMIT_MAX - 211 );
		ri = 0; 
		ri += RingIndex::LIMIT_MAX;
		ASSERT_EQ( ri, RingIndex::LIMIT_MAX % ri.get_max() );
		
		ri.set( ri.get_max() );
		ASSERT_EQ( ri, 0 );
	}